

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LogTailIdx.cpp
# Opt level: O0

void __thiscall liblogger::LogTailIdx::LogTailIdx(LogTailIdx *this,size_t length)

{
  _func_int **in_RSI;
  ILogger *in_RDI;
  
  ILogger::ILogger(in_RDI);
  in_RDI->_vptr_ILogger = (_func_int **)&PTR__LogTailIdx_001cc8c0;
  in_RDI[1]._vptr_ILogger = in_RSI;
  in_RDI[2]._vptr_ILogger = (_func_int **)0x0;
  std::
  map<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::map((map<unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         *)0x1aa0d8);
  return;
}

Assistant:

LogTailIdx::LogTailIdx(size_t length) :
	m_length(length),
	m_current(0)
{

}